

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Assimp.cpp
# Opt level: O1

void aiDetachAllLogStreams(void)

{
  Logger *pLVar1;
  _Rb_tree_node_base *p_Var2;
  int in_ESI;
  _Base_ptr p_Var3;
  __pid_t __pid;
  
  pLVar1 = Assimp::DefaultLogger::get();
  p_Var2 = (_Rb_tree_node_base *)Assimp::gActiveLogStreams._24_8_;
  if (pLVar1 != (Logger *)0x0) {
    for (; p_Var2 != (_Rb_tree_node_base *)(Assimp::gActiveLogStreams + 8);
        p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
      p_Var3 = p_Var2[1]._M_left;
      (*pLVar1->_vptr_Logger[3])(pLVar1,p_Var3,0xf);
      in_ESI = (int)p_Var3;
      if (p_Var2[1]._M_left != (_Base_ptr)0x0) {
        (**(code **)(*(long *)p_Var2[1]._M_left + 8))();
      }
    }
    __pid = 0x9c3de8;
    std::
    _Rb_tree<aiLogStream,_std::pair<const_aiLogStream,_Assimp::LogStream_*>,_std::_Select1st<std::pair<const_aiLogStream,_Assimp::LogStream_*>_>,_Assimp::mpred,_std::allocator<std::pair<const_aiLogStream,_Assimp::LogStream_*>_>_>
    ::clear((_Rb_tree<aiLogStream,_std::pair<const_aiLogStream,_Assimp::LogStream_*>,_std::_Select1st<std::pair<const_aiLogStream,_Assimp::LogStream_*>_>,_Assimp::mpred,_std::allocator<std::pair<const_aiLogStream,_Assimp::LogStream_*>_>_>
             *)Assimp::gActiveLogStreams);
    Assimp::DefaultLogger::kill(__pid,in_ESI);
  }
  return;
}

Assistant:

ASSIMP_API void aiDetachAllLogStreams(void)
{
    ASSIMP_BEGIN_EXCEPTION_REGION();
#ifndef ASSIMP_BUILD_SINGLETHREADED
    std::lock_guard<std::mutex> lock(gLogStreamMutex);
#endif
    Logger *logger( DefaultLogger::get() );
    if ( NULL == logger ) {
        return;
    }

    for (LogStreamMap::iterator it = gActiveLogStreams.begin(); it != gActiveLogStreams.end(); ++it) {
        logger->detatchStream( it->second );
        delete it->second;
    }
    gActiveLogStreams.clear();
    DefaultLogger::kill();

    ASSIMP_END_EXCEPTION_REGION(void);
}